

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_setCategoryRatesWithIndex
               (JNIEnv *env,jobject obj,jint instance,jint categoryRatesIndex,
               jdoubleArray inCategoryRates)

{
  jint jVar1;
  jdoubleArray array;
  undefined4 in_ECX;
  undefined4 in_EDX;
  JNIEnv_ *in_R8;
  jint errCode;
  jdouble *categoryRates;
  undefined4 in_stack_ffffffffffffffc8;
  jint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  array = (jdoubleArray)
          JNIEnv_::GetDoubleArrayElements
                    ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (jdoubleArray)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (jboolean *)0x1051be);
  jVar1 = beagleSetCategoryRatesWithIndex(in_EDX,in_ECX,array);
  JNIEnv_::ReleaseDoubleArrayElements
            (in_R8,array,(jdouble *)CONCAT44(jVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_setCategoryRatesWithIndex
  (JNIEnv *env, jobject obj, jint instance, jint categoryRatesIndex, jdoubleArray inCategoryRates)
{
    jdouble *categoryRates = env->GetDoubleArrayElements(inCategoryRates, NULL);

    jint errCode = (jint)beagleSetCategoryRatesWithIndex(instance,
                                                         categoryRatesIndex,
                                                         (double *)categoryRates);

    env->ReleaseDoubleArrayElements(inCategoryRates, categoryRates, JNI_ABORT);

    return errCode;
}